

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Secret_Input::handle(Fl_Secret_Input *this,int event)

{
  int iVar1;
  int retval;
  int event_local;
  Fl_Secret_Input *this_local;
  
  iVar1 = Fl_Input::handle(&this->super_Fl_Input,event);
  return iVar1;
}

Assistant:

int Fl_Secret_Input::handle(int event) {
  int retval = Fl_Input::handle(event);
#ifdef __APPLE__
  if (event == FL_KEYBOARD && Fl::compose_state) {
    this->mark( this->position() ); // don't underline marked text
  }
#endif
  return retval;
}